

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.c
# Opt level: O1

int mapApproxHeight(float *y,int *ids,Generator *g,SurfaceNoise *sn,int x,int z,int w,int h)

{
  double dVar1;
  double dVar2;
  Range r_00;
  int iVar3;
  int x_00;
  void *__ptr;
  size_t __nmemb;
  int *piVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  undefined4 *puVar11;
  int iVar12;
  int *piVar13;
  int y_00;
  long lVar14;
  int iVar15;
  long lVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  float fVar19;
  float fVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  int samplez;
  double d0;
  double s;
  double d;
  double s0;
  Range r;
  long local_5400;
  long local_53e8;
  long local_53c8;
  long local_53a0;
  long local_5390;
  double local_5348 [2];
  OctaveNoise *local_5338;
  float *local_5330;
  long local_5328;
  double local_5320;
  double local_5318;
  double local_5310;
  SurfaceNoiseBeta local_5308;
  
  if (g->dim == -1) {
    iVar3 = 0x7f;
  }
  else if (g->dim == 1) {
    iVar3 = 1;
    if (0xb < g->mc) {
      iVar3 = mapEndSurfaceHeight(y,&g->en,sn,x,z,w,h,4,0);
    }
  }
  else {
    if (g->mc < 0x16) {
      if (g->mc < 2) {
        initSurfaceNoiseBeta(&local_5308,g->seed);
        if (0 < h) {
          local_5400 = 0;
          do {
            if (0 < w) {
              lVar10 = 0;
              iVar3 = x * 4 + 2;
              do {
                dVar21 = approxSurfaceBeta((BiomeNoiseBeta *)&(g->field_5).field_0,&local_5308,iVar3
                                           ,(z + (int)local_5400) * 4 + 2);
                y[lVar10] = (float)dVar21;
                lVar10 = lVar10 + 1;
                iVar3 = iVar3 + 4;
              } while (w != lVar10);
            }
            local_5400 = local_5400 + 1;
            y = y + w;
          } while (local_5400 != h);
        }
      }
      else {
        lVar14 = (long)w;
        lVar10 = (long)h;
        __ptr = malloc(lVar14 * lVar10 * 0x10);
        local_5308.octmin.octcnt = 4;
        local_5308.octmin._4_4_ = x + -2;
        local_5308.octmin.octaves._0_4_ = z + -2;
        local_5308.octmin.octaves._4_4_ = w + 5;
        local_5308.octmax.octcnt = h + 5;
        local_5308.octmax._4_8_ = 0x100000000;
        __nmemb = getMinCacheSize(g,4,local_5308.octmin.octaves._4_4_,1,local_5308.octmax.octcnt);
        if (__nmemb == 0) {
          piVar4 = (int *)0x0;
        }
        else {
          piVar4 = (int *)calloc(__nmemb,4);
        }
        r_00.x = local_5308.octmin._4_4_;
        r_00.scale = local_5308.octmin.octcnt;
        r_00.z = (int)local_5308.octmin.octaves;
        r_00.sx = local_5308.octmin.octaves._4_4_;
        r_00.sz = local_5308.octmax.octcnt;
        r_00._20_8_ = local_5308.octmax._4_8_;
        genBiomes(g,piVar4,r_00);
        if (0 < h) {
          local_53a0 = 0;
          local_53c8 = 0;
          do {
            if (0 < w) {
              lVar7 = 0;
              piVar13 = piVar4;
              do {
                iVar3 = piVar4[(long)local_5308.octmin.octaves._4_4_ * (local_53c8 + 2) + lVar7 + 2]
                ;
                getBiomeDepthAndScale(iVar3,local_5348,&local_5310,(int *)0x0);
                dVar21 = 0.0;
                dVar22 = 0.0;
                dVar23 = 0.0;
                puVar11 = &DAT_0012e140;
                lVar5 = 0;
                lVar8 = local_53a0;
                do {
                  lVar16 = 0;
                  do {
                    getBiomeDepthAndScale
                              (*(int *)((long)piVar13 +
                                       lVar16 * 4 + local_5308.octmin.octaves._4_4_ * lVar8),
                               &local_5318,&local_5320,(int *)0x0);
                    fVar20 = (float)((double)(float)puVar11[lVar16] / (local_5318 + 2.0));
                    fVar19 = fVar20 * 0.5;
                    if (local_5318 <= local_5348[0]) {
                      fVar19 = fVar20;
                    }
                    dVar1 = (double)fVar19;
                    dVar23 = dVar23 + dVar1;
                    dVar21 = dVar21 + dVar1 * local_5318;
                    dVar22 = dVar22 + dVar1 * local_5320;
                    lVar16 = lVar16 + 1;
                  } while (lVar16 != 5);
                  lVar5 = lVar5 + 1;
                  puVar11 = puVar11 + 5;
                  lVar8 = lVar8 + 4;
                } while (lVar5 != 5);
                lVar8 = local_53c8 * lVar14 + lVar7;
                *(double *)((long)__ptr + lVar8 * 8) =
                     ((dVar21 / dVar23) * 4.0 + -1.0) * 0.125 * 17.0 * 0.015625;
                *(double *)((long)__ptr + lVar8 * 8 + (long)(h * w) * 8) =
                     96.0 / ((dVar22 / dVar23) * 0.9 + 0.1);
                if (ids != (int *)0x0) {
                  ids[lVar8] = iVar3;
                }
                lVar7 = lVar7 + 1;
                piVar13 = piVar13 + 1;
              } while (lVar7 != lVar14);
            }
            local_53c8 = local_53c8 + 1;
            local_53a0 = local_53a0 + 4;
          } while (local_53c8 != lVar10);
        }
        free(piVar4);
        if (0 < h) {
          local_5338 = &sn->octdepth;
          local_5390 = 0;
          do {
            if (0 < w) {
              iVar3 = z + (int)local_5390;
              local_5328 = local_5390 * lVar14;
              local_5330 = y + local_5328;
              lVar7 = 0;
              do {
                x_00 = x + (int)lVar7;
                dVar21 = sampleOctaveAmp(local_5338,(double)(x_00 * 200),10.0,(double)(iVar3 * 200),
                                         1.0,0.0,1);
                dVar21 = dVar21 * 8.191875;
                uVar17 = 0;
                uVar18 = 0;
                dVar22 = (double)(~-(ulong)(dVar21 < 0.0) & (ulong)dVar21 |
                                 (ulong)(dVar21 * -0.3) & -(ulong)(dVar21 < 0.0)) * 3.0 + -2.0;
                dVar21 = 1.0;
                if (dVar22 <= 1.0) {
                  dVar21 = dVar22;
                }
                dVar22 = *(double *)(&DAT_0012e128 + (ulong)(dVar21 * 0.265625 < 0.0) * 8);
                lVar8 = local_5328 + lVar7;
                iVar15 = 0x20;
                iVar12 = 0;
                iVar6 = 8;
                dVar23 = 0.0;
                do {
                  dVar1 = (double)CONCAT44(uVar18,uVar17);
                  iVar9 = iVar6 * 2;
                  lVar5 = 0;
                  do {
                    y_00 = iVar6 + (int)lVar5;
                    dVar24 = sampleSurfaceNoise(sn,x_00,y_00,iVar3);
                    dVar2 = ((double)iVar9 * -0.03125 + 1.0 + dVar21 * 0.265625 * dVar22 + -0.46875
                            + *(double *)((long)__ptr + lVar8 * 8)) *
                            *(double *)((long)__ptr + lVar8 * 8 + (long)(h * w) * 8);
                    dVar24 = (double)(~-(ulong)(0.0 < dVar2) & (ulong)dVar2 |
                                     (ulong)(dVar2 * 4.0) & -(ulong)(0.0 < dVar2)) + dVar24;
                    local_5348[lVar5] = dVar24;
                    if (0.0 <= dVar24 && (long)iVar12 < iVar6 + lVar5) {
                      dVar1 = dVar24;
                      iVar12 = y_00;
                    }
                    if (dVar24 < 0.0 && iVar6 + lVar5 < (long)iVar15) {
                      iVar15 = y_00;
                      dVar23 = dVar24;
                    }
                    lVar5 = lVar5 + 1;
                    iVar9 = iVar9 + 2;
                  } while (lVar5 == 1);
                  dVar24 = local_5348[0] / (local_5348[0] - local_5348[1]);
                  if (dVar24 <= 0.0) {
                    dVar24 = floor(dVar24);
                    uVar17 = SUB84(dVar24,0);
                    uVar18 = (undefined4)((ulong)dVar24 >> 0x20);
                  }
                  else {
                    dVar24 = ceil(dVar24);
                    uVar17 = SUB84(dVar24,0);
                    uVar18 = (undefined4)((ulong)dVar24 >> 0x20);
                  }
                  iVar6 = iVar6 + (int)(double)CONCAT44(uVar18,uVar17);
                  iVar9 = iVar12 + 1;
                  if (iVar12 < iVar6) {
                    iVar9 = iVar6;
                  }
                  iVar6 = iVar15 + -1;
                  if (iVar9 < iVar15) {
                    iVar6 = iVar9;
                  }
                  uVar17 = SUB84(dVar1,0);
                  uVar18 = (undefined4)((ulong)dVar1 >> 0x20);
                } while (1 < iVar15 - iVar12);
                local_5330[lVar7] = (float)(((double)iVar12 + dVar1 / (dVar1 - dVar23)) * 8.0);
                lVar7 = lVar7 + 1;
              } while (lVar7 != lVar14);
            }
            local_5390 = local_5390 + 1;
          } while (local_5390 != lVar10);
        }
        free(__ptr);
      }
    }
    else {
      iVar3 = *(int *)((long)&g->field_5 + 0x6008);
      if ((iVar3 != 4) && (iVar3 != -1)) {
        return 1;
      }
      if (0 < h) {
        lVar10 = (long)w;
        local_53e8 = 0;
        piVar4 = ids;
        do {
          if (0 < w) {
            lVar14 = 0;
            do {
              iVar3 = sampleBiomeNoise((BiomeNoise *)&(g->field_5).field_0,(int64_t *)&local_5308,
                                       (int)lVar14 + x,0,(int)local_53e8 + z,(uint64_t *)0x0,0);
              if (ids != (int *)0x0) {
                piVar4[lVar14] = iVar3;
              }
              y[lVar14] = (float)((double)(long)local_5308.octmain._0_8_ / 76.0);
              lVar14 = lVar14 + 1;
            } while (lVar10 != lVar14);
          }
          local_53e8 = local_53e8 + 1;
          piVar4 = piVar4 + lVar10;
          y = y + lVar10;
        } while (local_53e8 != h);
      }
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int mapApproxHeight(float *y, int *ids, const Generator *g, const SurfaceNoise *sn,
    int x, int z, int w, int h)
{
    if (g->dim == DIM_NETHER)
        return 127;

    if (g->dim == DIM_END)
    {
        if (g->mc <= MC_1_8)
            return 1;
        return mapEndSurfaceHeight(y, &g->en, sn, x, z, w, h, 4, 0);
    }

    if (g->mc >= MC_1_18)
    {
        if (g->bn.nptype != -1 && g->bn.nptype != NP_DEPTH)
            return 1;
        int64_t i, j;
        for (j = 0; j < h; j++)
        {
            for (i = 0; i < w; i++)
            {
                int flags = 0;//SAMPLE_NO_SHIFT;
                int64_t np[6];
                int id = sampleBiomeNoise(&g->bn, np, x+i, 0, z+j, 0, flags);
                if (ids)
                    ids[j*w+i] = id;
                y[j*w+i] = np[NP_DEPTH] / 76.0;
            }
        }
        return 0;
    }
    else if (g->mc <= MC_B1_7)
    {
        SurfaceNoiseBeta snb; // TODO: merge SurfaceNoise and SurfaceNoiseBeta?
        initSurfaceNoiseBeta(&snb, g->seed);
        int64_t i, j;
        for (j = 0; j < h; j++)
        {
            for (i = 0; i < w; i++)
            {
                int samplex = (x + i) * 4 + 2;
                int samplez = (z + j) * 4 + 2;
                // TODO: properly implement beta surface finder
                y[j*w+i] = approxSurfaceBeta(&g->bnb, &snb, samplex, samplez);
            }
        }
        return 0;
    }

    const float biome_kernel[25] = { // with 10 / (sqrt(i**2 + j**2) + 0.2)
        3.302044127, 4.104975761, 4.545454545, 4.104975761, 3.302044127,
        4.104975761, 6.194967155, 8.333333333, 6.194967155, 4.104975761,
        4.545454545, 8.333333333, 50.00000000, 8.333333333, 4.545454545,
        4.104975761, 6.194967155, 8.333333333, 6.194967155, 4.104975761,
        3.302044127, 4.104975761, 4.545454545, 4.104975761, 3.302044127,
    };

    double *depth = (double*) malloc(sizeof(double) * 2 * w * h);
    double *scale = depth + w * h;
    int64_t i, j;
    int ii, jj;

    Range r = {4, x-2, z-2, w+5, h+5, 0, 1};
    int *cache = allocCache(g, r);
    genBiomes(g, cache, r);

    for (j = 0; j < h; j++)
    {
        for (i = 0; i < w; i++)
        {
            double d0, s0;
            double wt = 0, ws = 0, wd = 0;
            int id0 = cache[(j+2)*r.sx + (i+2)];
            getBiomeDepthAndScale(id0, &d0, &s0, 0);

            for (jj = 0; jj < 5; jj++)
            {
                for (ii = 0; ii < 5; ii++)
                {
                    double d, s;
                    int id = cache[(j+jj)*r.sx + (i+ii)];
                    getBiomeDepthAndScale(id, &d, &s, 0);
                    float weight = biome_kernel[jj*5+ii] / (d + 2);
                    if (d > d0)
                        weight *= 0.5;
                    ws += s * weight;
                    wd += d * weight;
                    wt += weight;
                }
            }
            ws /= wt;
            wd /= wt;
            ws = ws * 0.9 + 0.1;
            wd = (wd * 4.0 - 1) / 8;
            ws = 96 / ws;
            wd = wd * 17./64;
            depth[j*w+i] = wd;
            scale[j*w+i] = ws;
            if (ids)
                ids[j*w+i] = id0;
        }
    }
    free(cache);

    for (j = 0; j < h; j++)
    {
        for (i = 0; i < w; i++)
        {
            int px = x+i, pz = z+j;
            double off = sampleOctaveAmp(&sn->octdepth, px*200, 10, pz*200, 1, 0, 1);
            off *= 65535./8000;
            if (off < 0) off = -0.3 * off;
            off = off * 3 - 2;
            if (off > 1) off = 1;
            off *= 17./64;
            if (off < 0) off *= 1./28;
            else off *= 1./40;

            double vmin = 0, vmax = 0;
            int ytest = 8, ymin = 0, ymax = 32;
            do
            {
                double v[2];
                int k;
                for (k = 0; k < 2; k++)
                {
                    int py = ytest + k;
                    double n0 = sampleSurfaceNoise(sn, px, py, pz);
                    double fall = 1 - 2 * py / 32.0 + off - 0.46875;
                    fall = scale[j*w+i] * (fall + depth[j*w+i]);
                    n0 += (fall > 0 ? 4*fall : fall);
                    v[k] = n0;
                    if (n0 >= 0 && py > ymin)
                    {
                        ymin = py;
                        vmin = n0;
                    }
                    if (n0 < 0 && py < ymax)
                    {
                        ymax = py;
                        vmax = n0;
                    }
                }
                double dy = v[0] / (v[0] - v[1]);
                dy = (dy <= 0 ? floor(dy) : ceil(dy)); // round away from zero
                ytest += (int) dy;
                if (ytest <= ymin) ytest = ymin+1;
                if (ytest >= ymax) ytest = ymax-1;
            }
            while (ymax - ymin > 1);

            y[j*w+i] = 8 * (vmin / (double)(vmin - vmax) + ymin);
        }
    }
    free(depth);
    return 0;
}